

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser.cc
# Opt level: O2

bool __thiscall DepfileParser::Parse(DepfileParser *this,string *content,string *err)

{
  byte *pbVar1;
  byte *pbVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  uint uVar9;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> _Var10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  uint uVar14;
  byte *__src;
  byte *pbVar15;
  byte *pbVar16;
  ulong uVar17;
  byte *__s;
  byte *pbVar18;
  bool bVar19;
  StringPiece piece;
  
  pbVar2 = (byte *)(content->_M_dataplus)._M_p;
  sVar3 = content->_M_string_length;
  bVar4 = true;
  bVar8 = false;
  bVar6 = false;
  pbVar16 = pbVar2;
LAB_00119bd2:
  __src = pbVar16;
  __s = pbVar16;
  if (pbVar16 < pbVar2 + sVar3) {
LAB_00119be7:
    do {
      while( true ) {
        bVar7 = *__src;
        uVar14 = (uint)__src;
        pbVar18 = __src;
        if (-1 < (char)""[bVar7]) break;
        do {
          pbVar15 = pbVar18 + 1;
          pbVar18 = pbVar18 + 1;
        } while ((char)""[*pbVar15] < '\0');
LAB_00119e1f:
        sVar13 = (size_t)(int)((int)pbVar18 - uVar14);
        if (__s < __src) {
          memmove(__s,__src,sVar13);
        }
        __src = pbVar18;
        __s = __s + sVar13;
      }
      pbVar15 = __src;
      if (bVar7 < 0xe) {
        if (bVar7 < 10) goto LAB_00119ebe;
        if (bVar7 != 10) {
          if (bVar7 != 0xd) goto LAB_00119ebe;
          pbVar15 = __src + 1;
          if (__src[1] != 10) goto LAB_00119fe1;
        }
        bVar19 = true;
        goto LAB_00119ec3;
      }
      if (0x24 < bVar7) {
        if (0x1c < (byte)(bVar7 - 0x40)) goto LAB_00119ebe;
        pbVar18 = __src + 1;
        bVar7 = __src[1];
        pbVar15 = pbVar18;
        if (0x20 < bVar7) {
          if (bVar7 < 0x3a) {
LAB_00119c68:
            pbVar18 = pbVar15;
            if (bVar7 == 0x23) {
              lVar12 = (long)(pbVar15 + 1) - (long)__src;
              iVar11 = (int)lVar12;
              if ((2 < iVar11) && (__s < __src)) {
                memset(__s,0x5c,(ulong)(iVar11 - 2));
              }
              __s[(lVar12 << 0x20) + -0x200000000 >> 0x20] = 0x23;
              __src = pbVar15 + 1;
              __s = __s + ((lVar12 << 0x20) + -0x200000000 >> 0x20) + 1;
              goto LAB_00119be7;
            }
          }
          else {
            if (bVar7 == 0x3a) {
LAB_00119d9a:
              pbVar1 = pbVar18 + 1;
              bVar7 = pbVar18[1];
              uVar9 = (uint)bVar7;
              if (bVar7 < 0xd) {
                if ((uVar9 < 0xb) && ((0x601U >> (uVar9 & 0x1f) & 1) != 0)) {
LAB_00119f9e:
                  pbVar15 = pbVar18 + 2;
                  sVar13 = (size_t)(int)(~uVar14 + (int)pbVar15);
                  if (__s < __src) {
                    memmove(__s,__src,sVar13);
                    bVar7 = *pbVar1;
                  }
                  __s = __s + sVar13;
                  bVar19 = bVar7 == 10;
                  goto LAB_00119ec6;
                }
              }
              else if ((bVar7 == 0xd) || (uVar9 == 0x20)) goto LAB_00119f9e;
              lVar12 = (long)pbVar1 - (long)__src;
              iVar11 = (int)lVar12;
              if ((2 < iVar11) && (__s < __src)) {
                memset(__s,0x5c,(ulong)(iVar11 - 2));
              }
              __s[(lVar12 << 0x20) + -0x200000000 >> 0x20] = 0x3a;
              __src = pbVar1;
              __s = __s + ((lVar12 << 0x20) + -0x200000000 >> 0x20) + 1;
              goto LAB_00119be7;
            }
            if (bVar7 == 0x5c) {
              lVar12 = 0x200000000;
              pbVar15 = __src + 3;
              do {
                bVar7 = pbVar15[-1];
                if (bVar7 < 0x21) {
                  pbVar18 = pbVar15 + -1;
                  if (bVar7 < 0xb) {
                    if (bVar7 == 0) goto LAB_00119e1f;
LAB_00119e66:
                    if (bVar7 != 10) goto LAB_00119e1c;
                    goto LAB_00119e1f;
                  }
                  if (bVar7 == 0xd) goto LAB_00119e1f;
                  if (bVar7 != 0x20) goto LAB_00119e1c;
                  if (__s < __src) {
                    memset(__s,0x5c,lVar12 >> 0x20);
                  }
                  __s = __s + (lVar12 >> 0x20);
                  bVar19 = false;
                  goto LAB_00119ec6;
                }
                if (bVar7 < 0x3a) {
                  pbVar15 = pbVar15 + -1;
                  goto LAB_00119c68;
                }
                if (bVar7 != 0x5c) {
                  pbVar18 = pbVar15 + -1;
                  break;
                }
                bVar7 = *pbVar15;
                pbVar18 = pbVar15;
                if (bVar7 < 0x21) {
                  if (bVar7 < 0xb) {
                    if (bVar7 != 0) goto LAB_00119e66;
                    goto LAB_00119e1f;
                  }
                  if (bVar7 == 0xd) goto LAB_00119e1f;
                  if (bVar7 != 0x20) goto LAB_00119e1c;
                  goto LAB_00119d51;
                }
                if (bVar7 < 0x3a) goto LAB_00119c68;
                lVar12 = lVar12 + 0x200000000;
                pbVar15 = pbVar15 + 2;
              } while (bVar7 == 0x5c);
              if (bVar7 == 0x3a) goto LAB_00119d9a;
            }
          }
LAB_00119e1c:
          pbVar18 = pbVar18 + 1;
          goto LAB_00119e1f;
        }
        if (bVar7 < 0xb) {
          if (bVar7 != 0) {
            if (bVar7 != 10) goto LAB_00119e1c;
            lVar12 = 1;
LAB_00119fda:
            pbVar15 = __src + lVar12 + 1;
          }
        }
        else {
          if (bVar7 == 0x20) {
LAB_00119d51:
            sVar13 = (long)((int)((int)(pbVar18 + 1) - uVar14) / 2) - 1;
            if (__s < __src) {
              memset(__s,0x5c,sVar13);
            }
            __s[sVar13] = 0x20;
            __src = pbVar18 + 1;
            __s = __s + sVar13 + 1;
            goto LAB_00119be7;
          }
          if (bVar7 != 0xd) goto LAB_00119e1c;
          lVar12 = 2;
          if (__src[2] == 10) goto LAB_00119fda;
        }
LAB_00119fe1:
        bVar19 = false;
        goto LAB_00119ec6;
      }
      if ((bVar7 != 0x24) || (__src[1] != 0x24)) goto LAB_00119ebe;
      *__s = 0x24;
      __src = __src + 2;
      __s = __s + 1;
    } while( true );
  }
  bVar8 = true;
  if (!bVar6) {
LAB_0011a01c:
    std::__cxx11::string::assign((char *)err);
    bVar8 = false;
  }
  return bVar8;
LAB_00119ebe:
  bVar19 = false;
LAB_00119ec3:
  pbVar15 = pbVar15 + 1;
LAB_00119ec6:
  uVar17 = (long)__s - (long)pbVar16;
  iVar11 = (int)uVar17;
  bVar5 = bVar4;
  if (0 < iVar11) {
    if (pbVar16[iVar11 - 1] == 0x3a) {
      bVar5 = false;
      bVar6 = true;
      uVar17 = (ulong)(iVar11 - 1U);
      if (iVar11 - 1U == 0) goto LAB_00119f88;
    }
    piece.len_ = uVar17 & 0xffffffff;
    piece.str_ = (char *)pbVar16;
    _Var10 = std::
             __find_if<__gnu_cxx::__normal_iterator<StringPiece*,std::vector<StringPiece,std::allocator<StringPiece>>>,__gnu_cxx::__ops::_Iter_equals_val<StringPiece_const>>
                       ((this->ins_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (this->ins_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                        _M_impl.super__Vector_impl_data._M_finish,&piece);
    if (_Var10._M_current ==
        (this->ins_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (bVar4) {
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<StringPiece*,std::vector<StringPiece,std::allocator<StringPiece>>>,__gnu_cxx::__ops::_Iter_equals_val<StringPiece_const>>
                           ((this->outs_).
                            super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (this->outs_).
                            super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                            super__Vector_impl_data._M_finish,&piece);
        if (_Var10._M_current ==
            (this->outs_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<StringPiece,_std::allocator<StringPiece>_>::push_back(&this->outs_,&piece);
        }
      }
      else {
        if (bVar8) goto LAB_0011a01c;
        std::vector<StringPiece,_std::allocator<StringPiece>_>::push_back(&this->ins_,&piece);
        bVar8 = false;
      }
    }
    else {
      bVar8 = (bool)(bVar4 | bVar8);
    }
  }
LAB_00119f88:
  bVar8 = (bool)(bVar8 & (bVar19 ^ 1U));
  bVar4 = (bool)(bVar5 | bVar19);
  pbVar16 = pbVar15;
  goto LAB_00119bd2;
}

Assistant:

bool DepfileParser::Parse(string* content, string* err) {
  // in: current parser input point.
  // end: end of input.
  // parsing_targets: whether we are parsing targets or dependencies.
  char* in = &(*content)[0];
  char* end = in + content->size();
  bool have_target = false;
  bool parsing_targets = true;
  bool poisoned_input = false;
  while (in < end) {
    bool have_newline = false;
    // out: current output point (typically same as in, but can fall behind
    // as we de-escape backslashes).
    char* out = in;
    // filename: start of the current parsed filename.
    char* filename = out;
    for (;;) {
      // start: beginning of the current parsed span.
      const char* start = in;
      char* yymarker = NULL;
      
    {
      unsigned char yych;
      static const unsigned char yybm[] = {
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0, 128,   0,   0,   0, 128,   0,   0, 
        128, 128,   0, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128,   0,   0, 128,   0,   0, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128,   0, 128,   0, 128, 
          0, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128,   0, 128, 128,   0, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
      };
      yych = *in;
      if (yybm[0+yych] & 128) {
        goto yy9;
      }
      if (yych <= '\r') {
        if (yych <= '\t') {
          if (yych >= 0x01) goto yy4;
        } else {
          if (yych <= '\n') goto yy6;
          if (yych <= '\f') goto yy4;
          goto yy8;
        }
      } else {
        if (yych <= '$') {
          if (yych <= '#') goto yy4;
          goto yy12;
        } else {
          if (yych <= '?') goto yy4;
          if (yych <= '\\') goto yy13;
          goto yy4;
        }
      }
      ++in;
      {
        break;
      }
yy4:
      ++in;
yy5:
      {
        // For any other character (e.g. whitespace), swallow it here,
        // allowing the outer logic to loop around again.
        break;
      }
yy6:
      ++in;
      {
        // A newline ends the current file name and the current rule.
        have_newline = true;
        break;
      }
yy8:
      yych = *++in;
      if (yych == '\n') goto yy6;
      goto yy5;
yy9:
      yych = *++in;
      if (yybm[0+yych] & 128) {
        goto yy9;
      }
yy11:
      {
        // Got a span of plain text.
        int len = (int)(in - start);
        // Need to shift it over if we're overwriting backslashes.
        if (out < start)
          memmove(out, start, len);
        out += len;
        continue;
      }
yy12:
      yych = *++in;
      if (yych == '$') goto yy14;
      goto yy5;
yy13:
      yych = *(yymarker = ++in);
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy5;
          if (yych <= '\t') goto yy16;
          goto yy17;
        } else {
          if (yych == '\r') goto yy19;
          if (yych <= 0x1F) goto yy16;
          goto yy21;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy27;
          goto yy16;
        }
      }
yy14:
      ++in;
      {
        // De-escape dollar character.
        *out++ = '$';
        continue;
      }
yy16:
      ++in;
      goto yy11;
yy17:
      ++in;
      {
        // A line continuation ends the current file name.
        break;
      }
yy19:
      yych = *++in;
      if (yych == '\n') goto yy17;
      in = yymarker;
      goto yy5;
yy21:
      ++in;
      {
        // 2N+1 backslashes plus space -> N backslashes plus space.
        int len = (int)(in - start);
        int n = len / 2 - 1;
        if (out < start)
          memset(out, '\\', n);
        out += n;
        *out++ = ' ';
        continue;
      }
yy23:
      ++in;
      {
        // De-escape hash sign, but preserve other leading backslashes.
        int len = (int)(in - start);
        if (len > 2 && out < start)
          memset(out, '\\', len - 2);
        out += len - 2;
        *out++ = '#';
        continue;
      }
yy25:
      yych = *++in;
      if (yych <= '\f') {
        if (yych <= 0x00) goto yy28;
        if (yych <= 0x08) goto yy26;
        if (yych <= '\n') goto yy28;
      } else {
        if (yych <= '\r') goto yy28;
        if (yych == ' ') goto yy28;
      }
yy26:
      {
        // De-escape colon sign, but preserve other leading backslashes.
        // Regular expression uses lookahead to make sure that no whitespace
        // nor EOF follows. In that case it'd be the : at the end of a target
        int len = (int)(in - start);
        if (len > 2 && out < start)
          memset(out, '\\', len - 2);
        out += len - 2;
        *out++ = ':';
        continue;
      }
yy27:
      yych = *++in;
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy11;
          if (yych <= '\t') goto yy16;
          goto yy11;
        } else {
          if (yych == '\r') goto yy11;
          if (yych <= 0x1F) goto yy16;
          goto yy30;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy32;
          goto yy16;
        }
      }
yy28:
      ++in;
      {
        // Backslash followed by : and whitespace.
        // It is therefore normal text and not an escaped colon
        int len = (int)(in - start - 1);
        // Need to shift it over if we're overwriting backslashes.
        if (out < start)
          memmove(out, start, len);
        out += len;
        if (*(in - 1) == '\n')
          have_newline = true;
        break;
      }
yy30:
      ++in;
      {
        // 2N backslashes plus space -> 2N backslashes, end of filename.
        int len = (int)(in - start);
        if (out < start)
          memset(out, '\\', len - 1);
        out += len - 1;
        break;
      }
yy32:
      yych = *++in;
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy11;
          if (yych <= '\t') goto yy16;
          goto yy11;
        } else {
          if (yych == '\r') goto yy11;
          if (yych <= 0x1F) goto yy16;
          goto yy21;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy27;
          goto yy16;
        }
      }
    }

    }

    int len = (int)(out - filename);
    const bool is_dependency = !parsing_targets;
    if (len > 0 && filename[len - 1] == ':') {
      len--;  // Strip off trailing colon, if any.
      parsing_targets = false;
      have_target = true;
    }

    if (len > 0) {
      StringPiece piece = StringPiece(filename, len);
      // If we've seen this as an input before, skip it.
      std::vector<StringPiece>::iterator pos = std::find(ins_.begin(), ins_.end(), piece);
      if (pos == ins_.end()) {
        if (is_dependency) {
          if (poisoned_input) {
            *err = "inputs may not also have inputs";
            return false;
          }
          // New input.
          ins_.push_back(piece);
        } else {
          // Check for a new output.
          if (std::find(outs_.begin(), outs_.end(), piece) == outs_.end())
            outs_.push_back(piece);
        }
      } else if (!is_dependency) {
        // We've passed an input on the left side; reject new inputs.
        poisoned_input = true;
      }
    }

    if (have_newline) {
      // A newline ends a rule so the next filename will be a new target.
      parsing_targets = true;
      poisoned_input = false;
    }
  }
  if (!have_target) {
    *err = "expected ':' in depfile";
    return false;
  }
  return true;
}